

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

void __thiscall FConfigFile::ClearConfig(FConfigFile *this)

{
  FConfigSection *this_00;
  FConfigSection *pFVar1;
  
  pFVar1 = this->Sections;
  this->CurrentSection = pFVar1;
  while (pFVar1 != (FConfigSection *)0x0) {
    pFVar1 = pFVar1->Next;
    ClearCurrentSection(this);
    this_00 = this->CurrentSection;
    if (this_00 != (FConfigSection *)0x0) {
      FString::~FString(&this_00->Note);
      FString::~FString(&this_00->SectionName);
      operator_delete(this_00,0x28);
    }
    this->CurrentSection = pFVar1;
  }
  this->Sections = (FConfigSection *)0x0;
  this->LastSectionPtr = &this->Sections;
  return;
}

Assistant:

void FConfigFile::ClearConfig ()
{
	CurrentSection = Sections;
	while (CurrentSection != NULL)
	{
		FConfigSection *next = CurrentSection->Next;
		ClearCurrentSection ();
		delete CurrentSection;
		CurrentSection = next;
	}
	Sections = NULL;
	LastSectionPtr = &Sections;
}